

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::MakeEchoProgress(cmMakefileTargetGenerator *this,EchoProgress *progress)

{
  string *a;
  ostream *poVar1;
  string local_1e0 [48];
  ostringstream local_1b0 [8];
  ostringstream progressArg;
  string local_38;
  EchoProgress *local_18;
  EchoProgress *progress_local;
  cmMakefileTargetGenerator *this_local;
  
  local_18 = progress;
  progress_local = (EchoProgress *)this;
  a = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this->LocalGenerator);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[12]>(&local_38,a,(char (*) [12])"/CMakeFiles");
  std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar1 = std::operator<<((ostream *)local_1b0,"$(CMAKE_PROGRESS_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->NumberOfProgressActions);
  std::operator<<(poVar1,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&local_18->Arg,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return;
}

Assistant:

void cmMakefileTargetGenerator::MakeEchoProgress(
  cmLocalUnixMakefileGenerator3::EchoProgress& progress) const
{
  progress.Dir =
    cmStrCat(this->LocalGenerator->GetBinaryDirectory(), "/CMakeFiles");
  std::ostringstream progressArg;
  progressArg << "$(CMAKE_PROGRESS_" << this->NumberOfProgressActions << ")";
  progress.Arg = progressArg.str();
}